

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usart_linux.c
# Opt level: O2

void * usart_rx_thread(void *arg)

{
  void *__buf;
  ulong uVar1;
  
  __buf = malloc(400);
  if (__buf == (void *)0x0) {
    csp_print_func("%s: malloc() failed, returned NULL\n","usart_rx_thread");
  }
  else {
    while( true ) {
      uVar1 = read(*(int *)((long)arg + 0x10),__buf,400);
      if ((int)(uint)uVar1 < 1) break;
      (**arg)(*(undefined8 *)((long)arg + 8),__buf,(uint)uVar1 & 0x7fffffff,0);
    }
    csp_print_func("%s: read() failed, returned: %d\n","usart_rx_thread",uVar1 & 0xffffffff);
  }
  exit(1);
}

Assistant:

static void * usart_rx_thread(void * arg) {

	usart_context_t * ctx = arg;
	const unsigned int CBUF_SIZE = 400;
	uint8_t * cbuf = malloc(CBUF_SIZE);
	if (cbuf == NULL) {
		csp_print("%s: malloc() failed, returned NULL\n", __func__);
		exit(1);
	}

	// Receive loop
	while (1) {
		int length = read(ctx->fd, cbuf, CBUF_SIZE);
		if (length <= 0) {
			csp_print("%s: read() failed, returned: %d\n", __func__, length);
			exit(1);
		}
		ctx->rx_callback(ctx->user_data, cbuf, length, NULL);
	}
	return NULL;
}